

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Method(string *__return_storage_ptr__,Namer *this,string *pre,string *suf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *suf_local;
  string *pre_local;
  Namer *this_local;
  
  local_28 = suf;
  suf_local = pre;
  pre_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  std::operator+(&local_68,pre,"_");
  std::operator+(&local_48,&local_68,local_28);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_48,(ulong)(this->config_).methods);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Method(const std::string &pre,
                             const std::string &suf) const {
    return Format(pre + "_" + suf, config_.methods);
  }